

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOUT_madhu.cpp
# Opt level: O0

vector<Track,_std::allocator<Track>_> *
IOU_tracker(vector<Track,_std::allocator<Track>_> *__return_storage_ptr__,float sigma_l,
           float sigma_h,float sigma_iou,int t_min,
           vector<std::vector<Boundingbox,_std::allocator<Boundingbox>_>,_std::allocator<std::vector<Boundingbox,_std::allocator<Boundingbox>_>_>_>
           *detections)

{
  int *this;
  code *pcVar1;
  Boundingbox box1;
  Boundingbox box1_00;
  Boundingbox box2;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  bool bVar5;
  size_type sVar6;
  reference __x;
  ulong uVar7;
  reference pvVar8;
  reference pvVar9;
  reference pBVar10;
  reference pTVar11;
  float fVar12;
  undefined4 in_stack_fffffffffffffd8c;
  undefined4 in_stack_fffffffffffffda4;
  float in_stack_fffffffffffffda8;
  undefined4 uVar13;
  undefined4 uStack_254;
  undefined1 local_1f8 [8];
  Track track_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<Track,_std::allocator<Track>_> *__range2_1;
  Track t;
  vector<Boundingbox,_std::allocator<Boundingbox>_> new_box;
  Boundingbox box;
  iterator __end2;
  iterator __begin2;
  vector<Boundingbox,_std::allocator<Boundingbox>_> *__range2;
  __normal_iterator<Track_*,_std::vector<Track,_std::allocator<Track>_>_> local_140;
  __normal_iterator<Track_*,_std::vector<Track,_std::allocator<Track>_>_> local_138;
  const_iterator local_130;
  Boundingbox *local_128;
  __normal_iterator<Boundingbox_*,_std::vector<Boundingbox,_std::allocator<Boundingbox>_>_>
  local_120;
  __normal_iterator<Boundingbox_*,_std::vector<Boundingbox,_std::allocator<Boundingbox>_>_>
  local_118;
  const_iterator local_110;
  undefined8 local_108;
  undefined8 uStack_100;
  float local_f8;
  undefined8 local_e8;
  undefined8 uStack_e0;
  float local_d8;
  vector<Boundingbox,_std::allocator<Boundingbox>_> local_d0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  float local_a8;
  undefined1 local_a0 [8];
  Track track;
  int i;
  undefined1 local_68 [8];
  vector<Boundingbox,_std::allocator<Boundingbox>_> frame_boxes;
  int frame_no;
  vector<Track,_std::allocator<Track>_> active_tracks;
  bool updated;
  int index;
  vector<std::vector<Boundingbox,_std::allocator<Boundingbox>_>,_std::allocator<std::vector<Boundingbox,_std::allocator<Boundingbox>_>_>_>
  *detections_local;
  int t_min_local;
  float sigma_iou_local;
  float sigma_h_local;
  float sigma_l_local;
  vector<Track,_std::allocator<Track>_> *finished_tracks;
  
  std::vector<Track,_std::allocator<Track>_>::vector
            ((vector<Track,_std::allocator<Track>_> *)&frame_no);
  frame_boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  std::vector<Track,_std::allocator<Track>_>::vector(__return_storage_ptr__);
  frame_boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  sVar6 = std::
          vector<std::vector<Boundingbox,_std::allocator<Boundingbox>_>,_std::allocator<std::vector<Boundingbox,_std::allocator<Boundingbox>_>_>_>
          ::size(detections);
  if (sVar6 != 0) {
    __x = std::
          vector<std::vector<Boundingbox,_std::allocator<Boundingbox>_>,_std::allocator<std::vector<Boundingbox,_std::allocator<Boundingbox>_>_>_>
          ::operator[](detections,
                       (long)(int)frame_boxes.
                                  super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<Boundingbox,_std::allocator<Boundingbox>_>::vector
              ((vector<Boundingbox,_std::allocator<Boundingbox>_> *)local_68,__x);
    track.track_id = 0;
    while( true ) {
      uVar7 = (ulong)track.track_id;
      sVar6 = std::vector<Track,_std::allocator<Track>_>::size
                        ((vector<Track,_std::allocator<Track>_> *)&frame_no);
      if (sVar6 <= uVar7) break;
      pvVar8 = std::vector<Track,_std::allocator<Track>_>::operator[]
                         ((vector<Track,_std::allocator<Track>_> *)&frame_no,(long)track.track_id);
      Track::Track((Track *)local_a0,pvVar8);
      active_tracks.super__Vector_base<Track,_std::allocator<Track>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
      pvVar9 = std::vector<Boundingbox,_std::allocator<Boundingbox>_>::back
                         ((vector<Boundingbox,_std::allocator<Boundingbox>_> *)local_a0);
      local_a8 = pvVar9->score;
      local_b8._0_4_ = pvVar9->x;
      local_b8._4_4_ = pvVar9->y;
      uStack_b0._0_4_ = pvVar9->w;
      uStack_b0._4_4_ = pvVar9->h;
      std::vector<Boundingbox,_std::allocator<Boundingbox>_>::vector
                (&local_d0,(vector<Boundingbox,_std::allocator<Boundingbox>_> *)local_68);
      box1.w = (float)(undefined4)uStack_b0;
      box1.h = (float)uStack_b0._4_4_;
      box1.x = (float)(undefined4)local_b8;
      box1.y = (float)local_b8._4_4_;
      box1.score = local_a8;
      active_tracks.super__Vector_base<Track,_std::allocator<Track>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = Highest_iou(box1,&local_d0);
      std::vector<Boundingbox,_std::allocator<Boundingbox>_>::~vector(&local_d0);
      if (active_tracks.super__Vector_base<Track,_std::allocator<Track>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ != -1) {
        pvVar9 = std::vector<Boundingbox,_std::allocator<Boundingbox>_>::back
                           ((vector<Boundingbox,_std::allocator<Boundingbox>_> *)local_a0);
        local_d8 = pvVar9->score;
        local_e8._0_4_ = pvVar9->x;
        local_e8._4_4_ = pvVar9->y;
        uStack_e0._0_4_ = pvVar9->w;
        uStack_e0._4_4_ = pvVar9->h;
        pvVar9 = std::vector<Boundingbox,_std::allocator<Boundingbox>_>::operator[]
                           ((vector<Boundingbox,_std::allocator<Boundingbox>_> *)local_68,
                            (long)active_tracks.super__Vector_base<Track,_std::allocator<Track>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        local_f8 = pvVar9->score;
        local_108._0_4_ = pvVar9->x;
        local_108._4_4_ = pvVar9->y;
        uStack_100._0_4_ = pvVar9->w;
        uStack_100._4_4_ = pvVar9->h;
        uVar2 = pvVar9->w;
        uVar3 = pvVar9->h;
        uVar4 = pvVar9->score;
        box2.w = (float)uVar4;
        box2.y = (float)uVar3;
        box2.x = (float)uVar2;
        box1_00.w = local_d8;
        box1_00.x = (float)(undefined4)uStack_e0;
        box1_00.y = (float)uStack_e0._4_4_;
        box1_00.h = (float)in_stack_fffffffffffffd8c;
        box1_00.score = (float)(undefined4)local_108;
        box2.h = (float)in_stack_fffffffffffffda4;
        box2.score = in_stack_fffffffffffffda8;
        fVar12 = find_IOU(box1_00,box2);
        if (sigma_iou <= fVar12) {
          pvVar9 = std::vector<Boundingbox,_std::allocator<Boundingbox>_>::operator[]
                             ((vector<Boundingbox,_std::allocator<Boundingbox>_> *)local_68,
                              (long)active_tracks.super__Vector_base<Track,_std::allocator<Track>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          std::vector<Boundingbox,_std::allocator<Boundingbox>_>::push_back
                    ((vector<Boundingbox,_std::allocator<Boundingbox>_> *)local_a0,pvVar9);
          fVar12 = track.boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl
                   .super__Vector_impl_data._M_end_of_storage._0_4_;
          pvVar9 = std::vector<Boundingbox,_std::allocator<Boundingbox>_>::operator[]
                             ((vector<Boundingbox,_std::allocator<Boundingbox>_> *)local_68,
                              (long)active_tracks.super__Vector_base<Track,_std::allocator<Track>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          if (fVar12 < pvVar9->score) {
            pvVar9 = std::vector<Boundingbox,_std::allocator<Boundingbox>_>::operator[]
                               ((vector<Boundingbox,_std::allocator<Boundingbox>_> *)local_68,
                                (long)active_tracks.
                                      super__Vector_base<Track,_std::allocator<Track>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage._4_4_);
            track.boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._0_4_ = pvVar9->score;
          }
          local_120._M_current =
               (Boundingbox *)
               std::vector<Boundingbox,_std::allocator<Boundingbox>_>::begin
                         ((vector<Boundingbox,_std::allocator<Boundingbox>_> *)local_68);
          local_118 = __gnu_cxx::
                      __normal_iterator<Boundingbox_*,_std::vector<Boundingbox,_std::allocator<Boundingbox>_>_>
                      ::operator+(&local_120,
                                  (long)active_tracks.
                                        super__Vector_base<Track,_std::allocator<Track>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage._4_4_);
          __gnu_cxx::
          __normal_iterator<Boundingbox_const*,std::vector<Boundingbox,std::allocator<Boundingbox>>>
          ::__normal_iterator<Boundingbox*>
                    ((__normal_iterator<Boundingbox_const*,std::vector<Boundingbox,std::allocator<Boundingbox>>>
                      *)&local_110,&local_118);
          local_128 = (Boundingbox *)
                      std::vector<Boundingbox,_std::allocator<Boundingbox>_>::erase
                                ((vector<Boundingbox,_std::allocator<Boundingbox>_> *)local_68,
                                 local_110);
          pvVar8 = std::vector<Track,_std::allocator<Track>_>::operator[]
                             ((vector<Track,_std::allocator<Track>_> *)&frame_no,
                              (long)track.track_id);
          Track::operator=(pvVar8,(Track *)local_a0);
          active_tracks.super__Vector_base<Track,_std::allocator<Track>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
        }
      }
      if ((active_tracks.super__Vector_base<Track,_std::allocator<Track>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._3_1_ & 1) == 0) {
        if (sigma_h < track.boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_) {
          sVar6 = std::vector<Boundingbox,_std::allocator<Boundingbox>_>::size
                            ((vector<Boundingbox,_std::allocator<Boundingbox>_> *)local_a0);
          if ((ulong)(long)t_min < sVar6) {
            std::vector<Track,_std::allocator<Track>_>::push_back
                      (__return_storage_ptr__,(value_type *)local_a0);
          }
        }
        local_140._M_current =
             (Track *)std::vector<Track,_std::allocator<Track>_>::begin
                                ((vector<Track,_std::allocator<Track>_> *)&frame_no);
        local_138 = __gnu_cxx::
                    __normal_iterator<Track_*,_std::vector<Track,_std::allocator<Track>_>_>::
                    operator+(&local_140,(long)track.track_id);
        __gnu_cxx::__normal_iterator<Track_const*,std::vector<Track,std::allocator<Track>>>::
        __normal_iterator<Track*>
                  ((__normal_iterator<Track_const*,std::vector<Track,std::allocator<Track>>> *)
                   &local_130,&local_138);
        std::vector<Track,_std::allocator<Track>_>::erase
                  ((vector<Track,_std::allocator<Track>_> *)&frame_no,local_130);
        track.track_id = track.track_id + -1;
      }
      Track::~Track((Track *)local_a0);
      track.track_id = track.track_id + 1;
    }
    __end2 = std::vector<Boundingbox,_std::allocator<Boundingbox>_>::begin
                       ((vector<Boundingbox,_std::allocator<Boundingbox>_> *)local_68);
    register0x00000000 =
         std::vector<Boundingbox,_std::allocator<Boundingbox>_>::end
                   ((vector<Boundingbox,_std::allocator<Boundingbox>_> *)local_68);
    while( true ) {
      bVar5 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<Boundingbox_*,_std::vector<Boundingbox,_std::allocator<Boundingbox>_>_>
                                  *)&box.score);
      if (!bVar5) break;
      pBVar10 = __gnu_cxx::
                __normal_iterator<Boundingbox_*,_std::vector<Boundingbox,_std::allocator<Boundingbox>_>_>
                ::operator*(&__end2);
      box.w = pBVar10->score;
      new_box.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = *(pointer *)pBVar10;
      box.x = pBVar10->w;
      box.y = pBVar10->h;
      this = &t.track_id;
      uVar13 = SUB84(this,0);
      uStack_254 = (undefined4)((ulong)this >> 0x20);
      std::vector<Boundingbox,_std::allocator<Boundingbox>_>::vector
                ((vector<Boundingbox,_std::allocator<Boundingbox>_> *)this);
      std::vector<Boundingbox,_std::allocator<Boundingbox>_>::push_back
                ((vector<Boundingbox,_std::allocator<Boundingbox>_> *)CONCAT44(uStack_254,uVar13),
                 (value_type *)
                 &new_box.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<Boundingbox,_std::allocator<Boundingbox>_>::vector
                ((vector<Boundingbox,_std::allocator<Boundingbox>_> *)&__range2_1,
                 (vector<Boundingbox,_std::allocator<Boundingbox>_> *)&t.track_id);
      t.boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = box.w;
      t.boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           (int)frame_boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
      t.max_score = 0.0;
      std::vector<Track,_std::allocator<Track>_>::push_back
                ((vector<Track,_std::allocator<Track>_> *)&frame_no,(value_type *)&__range2_1);
      Track::~Track((Track *)&__range2_1);
      std::vector<Boundingbox,_std::allocator<Boundingbox>_>::~vector
                ((vector<Boundingbox,_std::allocator<Boundingbox>_> *)&t.track_id);
      __gnu_cxx::
      __normal_iterator<Boundingbox_*,_std::vector<Boundingbox,_std::allocator<Boundingbox>_>_>::
      operator++(&__end2);
    }
    __end2_1 = std::vector<Track,_std::allocator<Track>_>::begin
                         ((vector<Track,_std::allocator<Track>_> *)&frame_no);
    track_1._32_8_ =
         std::vector<Track,_std::allocator<Track>_>::end
                   ((vector<Track,_std::allocator<Track>_> *)&frame_no);
    while( true ) {
      bVar5 = __gnu_cxx::operator!=
                        (&__end2_1,
                         (__normal_iterator<Track_*,_std::vector<Track,_std::allocator<Track>_>_> *)
                         &track_1.track_id);
      if (!bVar5) break;
      pTVar11 = __gnu_cxx::__normal_iterator<Track_*,_std::vector<Track,_std::allocator<Track>_>_>::
                operator*(&__end2_1);
      Track::Track((Track *)local_1f8,pTVar11);
      if (sigma_h <=
          track_1.boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_) {
        sVar6 = std::vector<Boundingbox,_std::allocator<Boundingbox>_>::size
                          ((vector<Boundingbox,_std::allocator<Boundingbox>_> *)local_1f8);
        if ((ulong)(long)t_min <= sVar6) {
          std::vector<Track,_std::allocator<Track>_>::push_back
                    (__return_storage_ptr__,(value_type *)local_1f8);
        }
      }
      Track::~Track((Track *)local_1f8);
      __gnu_cxx::__normal_iterator<Track_*,_std::vector<Track,_std::allocator<Track>_>_>::operator++
                (&__end2_1);
    }
    frame_boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
    std::vector<Boundingbox,_std::allocator<Boundingbox>_>::~vector
              ((vector<Boundingbox,_std::allocator<Boundingbox>_> *)local_68);
    if ((frame_boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
      std::vector<Track,_std::allocator<Track>_>::~vector(__return_storage_ptr__);
    }
    std::vector<Track,_std::allocator<Track>_>::~vector
              ((vector<Track,_std::allocator<Track>_> *)&frame_no);
    return __return_storage_ptr__;
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

std::vector< Track > IOU_tracker(float sigma_l, float sigma_h, float sigma_iou, int t_min, std::vector< std::vector<Boundingbox> > detections)
{
	
	int index;
	bool updated;

	// initiate active tracks, finished tracks
	std::vector<Track> active_tracks;
	std::vector<Track> finished_tracks;

	// do for all the frames
	for (int frame_no = 0; frame_no < detections.size(); frame_no++)
	{
		// get detections from the frame
		std::vector<Boundingbox> frame_boxes = detections[frame_no];

		// for each track in active tracks
		for (int i = 0; i < active_tracks.size(); i++)
		{
			Track track = active_tracks[i];
			updated = false;
			// the index of box with highest iou
			index = Highest_iou(track.boxes.back(), frame_boxes);

			// if no box is found or 
			if (index != -1 && find_IOU(track.boxes.back(), frame_boxes[index]) >= sigma_iou)
			{
				track.boxes.push_back(frame_boxes[index]);

				if (track.max_score < frame_boxes[index].score)
				{
					// update the score in tracks
					track.max_score = frame_boxes[index].score;
				}
				frame_boxes.erase(frame_boxes.begin() + index);

				// updating the track
				active_tracks[i] = track;
				updated = true;
			}

			// if not updated, append them into finished tracks
			if (!updated)
			{
				if (track.max_score > sigma_h && track.boxes.size() > t_min)
				{
					finished_tracks.push_back(track);	
				}
				// 
				active_tracks.erase(active_tracks.begin() + i);

				i--;
			}
		}

		// add new tracks in active tracks
		for ( auto box : frame_boxes)
		{
			std::vector<Boundingbox> new_box;

			new_box.push_back(box);

			Track t = {new_box, box.score, frame_no, 0};
			
			active_tracks.push_back(t);
		}

		// creating new tracks
		for (auto track : active_tracks)
		{
			if (track.max_score >= sigma_h && track.boxes.size() >= t_min)
			{
				finished_tracks.push_back(track);
			}
		}

		return finished_tracks;

	}
}